

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

int __thiscall BinNE<0,_4,_0>::checkSatisfied(BinNE<0,_4,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  
  if ((this->super_Propagator).satisfied.v == '\0') {
    bVar3 = BoolView::isFalse(&this->r);
    if (bVar3) {
      iVar5 = 1;
    }
    else {
      pIVar1 = (this->x).var;
      pIVar2 = (this->y).var;
      lVar4 = (long)(this->y).b;
      if ((pIVar2->max).v + lVar4 < (long)(pIVar1->min).v) {
        iVar5 = 3;
      }
      else {
        iVar5 = 3;
        if ((pIVar2->min).v + lVar4 <= (long)(pIVar1->max).v) {
          return 3;
        }
      }
    }
    Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
  }
  else {
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() > y.getMax() || x.getMax() < y.getMin()) {
			satisfied = true;
		}
		return 3;
	}